

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O1

iterator * __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
left_most_traversal(iterator *this,node_ptr node)

{
  ulong uVar1;
  node_type type;
  undefined1 local_50 [8];
  iter_result e;
  
  e.prefix.u64 = (uint64_t)&this->stack_;
  do {
    if (node.tagged_ptr == 0) {
      __assert_fail("node != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                    ,0x473,
                    "typename db<Key, Value>::iterator &unodb::db<unsigned long, std::span<const std::byte>>::iterator::left_most_traversal(detail::node_ptr) [Key = unsigned long, Value = std::span<const std::byte>]"
                   );
    }
    uVar1 = node.tagged_ptr & 7;
    type = (node_type)node.tagged_ptr & (I256|I48);
    if ((node.tagged_ptr & 7) == 0) {
      e.node.tagged_ptr._0_2_ = 0xffff;
      e.key_byte = 0;
      e.child_index = '\0';
      e._10_6_ = 0;
      local_50 = (undefined1  [8])node.tagged_ptr;
      std::
      deque<unodb::detail::iter_result<unodb::detail::node_header>,std::allocator<unodb::detail::iter_result<unodb::detail::node_header>>>
      ::emplace_back<unodb::detail::iter_result<unodb::detail::node_header>>
                ((deque<unodb::detail::iter_result<unodb::detail::node_header>,std::allocator<unodb::detail::iter_result<unodb::detail::node_header>>>
                  *)e.prefix,(iter_result *)local_50);
    }
    else {
      detail::
      basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
      ::begin((iter_result *)local_50,
              (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
               *)(node.tagged_ptr & 0xfffffffffffffff8),type);
      push(this,(iter_result *)local_50);
      node.tagged_ptr =
           (uintptr_t)
           detail::
           basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
           ::get_child((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                        *)(node.tagged_ptr & 0xfffffffffffffff8),type,e.node.tagged_ptr._1_1_);
    }
  } while (uVar1 != 0);
  return this;
}

Assistant:

typename db<Key, Value>::iterator&
db<Key, Value>::iterator::left_most_traversal(detail::node_ptr node) {
  while (true) {
    UNODB_DETAIL_ASSERT(node != nullptr);
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      push_leaf(node);
      return *this;  // done
    }
    // recursive descent.
    auto* const inode{node.ptr<inode_type*>()};
    const auto e =
        inode->begin(node_type);  // first child of current internal node
    push(e);                      // push the entry on the stack.
    node = inode->get_child(node_type, e.child_index);  // get the child
  }
  UNODB_DETAIL_CANNOT_HAPPEN();
}